

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

char * Scl_LibertyReadDefaultWireLoadSel(Scl_Tree_t *p)

{
  uint uVar1;
  int iVar2;
  Scl_Item_t *pSVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  Scl_Item_t *pSVar7;
  
  pSVar3 = p->pItems;
  uVar1 = pSVar3->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if (pSVar3 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
      pSVar7 = pSVar3 + uVar1;
      pcVar6 = p->pContents;
      do {
        iVar5 = (pSVar7->Key).Beg;
        iVar4 = (pSVar7->Key).End - iVar5;
        iVar5 = strncmp(pcVar6 + iVar5,"default_wire_load_selection",(long)iVar4);
        if (iVar4 == 0x1b && iVar5 == 0) {
          pcVar6 = Scl_LibertyReadString(p,pSVar7->Head);
          return pcVar6;
        }
        uVar1 = pSVar7->Next;
        if (iVar2 <= (int)uVar1) goto LAB_0045e48b;
        pSVar7 = pSVar3 + uVar1;
        if ((int)uVar1 < 0) {
          pSVar7 = (Scl_Item_t *)0x0;
        }
      } while (pSVar7 != (Scl_Item_t *)0x0);
    }
    return "";
  }
LAB_0045e48b:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

char * Scl_LibertyReadDefaultWireLoadSel( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_wire_load_selection" )
        return Scl_LibertyReadString(p, pItem->Head);
    return "";
}